

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wildmidi_lib.cpp
# Opt level: O3

void WM_FreePatches(void)

{
  short **ppsVar1;
  _patch *p_Var2;
  _patch *__ptr;
  _sample *p_Var3;
  long lVar4;
  
  FCriticalSection::Enter(&patch_lock);
  lVar4 = 0;
  do {
    __ptr = patch[lVar4];
    while (__ptr != (_patch *)0x0) {
      p_Var3 = __ptr->first_sample;
      while (p_Var3 != (_sample *)0x0) {
        ppsVar1 = &p_Var3->data;
        p_Var3 = p_Var3->next;
        free(*ppsVar1);
        free(__ptr->first_sample);
        __ptr->first_sample = p_Var3;
      }
      free(__ptr->filename);
      p_Var2 = __ptr->next;
      free(__ptr);
      patch[lVar4] = p_Var2;
      __ptr = p_Var2;
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x80);
  FCriticalSection::Leave(&patch_lock);
  return;
}

Assistant:

static void WM_FreePatches(void) {
	int i;
	struct _patch * tmp_patch;
	struct _sample * tmp_sample;

	patch_lock.Enter();
	for (i = 0; i < 128; i++) {
		while (patch[i]) {
			while (patch[i]->first_sample) {
				tmp_sample = patch[i]->first_sample->next;
				free(patch[i]->first_sample->data);
				free(patch[i]->first_sample);
				patch[i]->first_sample = tmp_sample;
			}
			free(patch[i]->filename);
			tmp_patch = patch[i]->next;
			free(patch[i]);
			patch[i] = tmp_patch;
		}
	}
	patch_lock.Leave();
}